

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void doWork(void)

{
  string *unaff_retaddr;
  float in_stack_ffffffffffffff3c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  allocator *paVar1;
  allocator local_99;
  string local_98 [39];
  allocator local_71;
  string local_70 [48];
  string local_40 [12];
  DataType in_stack_ffffffffffffffcc;
  MeshData<geometrycentral::surface::Vertex,_double> *in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  SurfaceMesh *in_stack_ffffffffffffffe0;
  string *in_stack_fffffffffffffff8;
  
  std::__cxx11::to_string(in_stack_ffffffffffffff3c);
  std::operator+(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"",&local_71);
  polyscope::warning(unaff_retaddr,in_stack_fffffffffffffff8);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffe0);
  std::__cxx11::string::~string(local_40);
  std::
  unique_ptr<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>
  ::operator->((unique_ptr<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>
                *)0x192841);
  geometrycentral::surface::IntrinsicGeometryInterface::requireVertexGaussianCurvatures
            ((IntrinsicGeometryInterface *)0x192849);
  paVar1 = &local_99;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"curvature",paVar1);
  std::
  unique_ptr<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>
  ::operator->((unique_ptr<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>
                *)0x192888);
  polyscope::SurfaceMesh::
  addVertexScalarQuantity<geometrycentral::MeshData<geometrycentral::surface::Vertex,double>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffcc);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  return;
}

Assistant:

void doWork() {
  polyscope::warning("Computing Gaussian curvature.\nalso, parameter value = " +
                     std::to_string(param1));

  geometry->requireVertexGaussianCurvatures();
  psMesh->addVertexScalarQuantity("curvature",
                                  geometry->vertexGaussianCurvatures,
                                  polyscope::DataType::SYMMETRIC);
}